

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

void __thiscall QPDF::resolveObjectsInStream(QPDF *this,int obj_stream_number)

{
  _Base_ptr p_Var1;
  char cVar2;
  long lVar3;
  size_t *psVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar8;
  mapped_type *pmVar9;
  Members *pMVar10;
  long *plVar11;
  QPDFObjGen *pQVar12;
  qpdf_offset_t qVar13;
  iterator iVar14;
  QPDFExc *pQVar15;
  __uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *p_Var16;
  uint uVar17;
  _Base_ptr p_Var18;
  ulong *puVar19;
  ulong uVar20;
  long *plVar21;
  ulong *puVar22;
  ulong uVar23;
  __uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> _Var24;
  _Base_ptr p_Var25;
  ulong uVar26;
  size_type *psVar27;
  element_type *peVar28;
  __index_type _Var29;
  size_t *psVar30;
  undefined8 uVar31;
  QPDFObjGen QVar32;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var33;
  uint uVar34;
  OffsetBuffer *pOVar35;
  uint uVar36;
  QPDFObjGen og;
  string __str;
  int first;
  int id;
  uint n;
  string __str_1;
  Token tnum;
  QPDFObjectHandle dict;
  anon_class_16_2_1298170d damaged;
  vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
  offsets;
  Token toffset;
  shared_ptr<Buffer> bp;
  QPDFObjGen stream_og;
  OffsetBuffer in;
  BufferInputSource input;
  uint local_534;
  string local_530;
  string local_510;
  OffsetBuffer *local_4f0;
  int local_4e4;
  ulong local_4e0;
  uint local_4d4;
  uint local_4d0;
  uint local_4cc;
  string local_4c8;
  string local_4a8;
  Stream local_488;
  size_t local_470;
  qpdf_offset_t local_468;
  ulong *local_460;
  long local_458;
  ulong local_450 [2];
  undefined1 local_440 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_428;
  _Alloc_hider local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  _Alloc_hider local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  string local_3d8;
  size_t *local_3b8;
  size_t *psStack_3b0;
  long local_3a8;
  undefined1 local_398 [16];
  undefined1 local_388 [24];
  _Alloc_hider local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  _Alloc_hider local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  Stream local_310;
  QPDFObjGen local_300 [2];
  QPDFObjGen local_2f0;
  uchar *local_2e0;
  qpdf_offset_t local_2d8;
  qpdf_offset_t local_2d0;
  QPDFObjectHandle local_2c8;
  key_type local_2b8;
  undefined1 local_2b0 [168];
  BufferInputSource local_208;
  undefined1 local_118 [232];
  
  _Var33._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var1 = (_Base_ptr)((long)&(_Var33._M_head_impl)->resolved_object_streams + 8);
  p_Var18 = p_Var1;
  for (p_Var25 = *(_Base_ptr *)((long)&(_Var33._M_head_impl)->resolved_object_streams + 0x10);
      p_Var25 != (_Base_ptr)0x0;
      p_Var25 = *(_Base_ptr *)
                 ((long)&p_Var25->_M_left +
                 (ulong)((int)p_Var25[1]._M_color < obj_stream_number) * 8)) {
    if (obj_stream_number <= (int)p_Var25[1]._M_color) {
      p_Var18 = p_Var25;
    }
  }
  p_Var25 = p_Var1;
  if ((p_Var18 != p_Var1) && (p_Var25 = p_Var18, obj_stream_number < (int)p_Var18[1]._M_color)) {
    p_Var25 = p_Var1;
  }
  if (p_Var25 != p_Var1) {
    return;
  }
  local_534 = obj_stream_number;
  local_3d8.field_2._M_allocated_capacity = (size_type)this;
  local_3d8.field_2._8_4_ = obj_stream_number;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &(_Var33._M_head_impl)->resolved_object_streams,(int *)&local_534);
  _Var29 = '\0';
  local_4f0 = (OffsetBuffer *)this;
  getObject((QPDF *)local_2b0,(int)this,local_534);
  if ((Members *)local_2b0._0_8_ != (Members *)0x0) {
    _Var29 = (__index_type)(((Tokenizer *)(local_2b0._0_8_ + 0x18))->val)._M_string_length;
    if (_Var29 == '\x0f') {
      pvVar8 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         ((variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           *)local_2b0._0_8_);
    }
    else {
      if (_Var29 != '\r') goto LAB_0023023a;
      pvVar8 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)resolve((QPDF *)(((Tokenizer *)(local_2b0._0_8_ + 0x18))->raw_val)._M_dataplus.
                                  _M_p,
                          (QPDFObjGen)
                          (((Tokenizer *)(local_2b0._0_8_ + 0x18))->raw_val)._M_string_length);
    }
    _Var29 = *(__index_type *)
              ((long)&(((pvVar8->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->value).
                      super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              + 0x30);
  }
LAB_0023023a:
  if (_Var29 == '\n') {
    local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_2b0._0_8_;
    local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_2b0._8_8_ + 8) = *(_Atomic_word *)(local_2b0._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_2b0._8_8_ + 8) = *(_Atomic_word *)(local_2b0._8_8_ + 8) + 1;
      }
    }
  }
  else {
    local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_);
  }
  pOVar35 = local_4f0;
  if ((Members *)
      local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (Members *)0x0) {
    pQVar15 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::to_string((string *)local_440,local_534);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   "object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440);
    p_Var16 = (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
              std::__cxx11::string::append(local_118);
    local_2b0._0_8_ = p_Var16->_M_t;
    _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)(p_Var16 + 2);
    if ((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)local_2b0._0_8_ ==
        (_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
        _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl) {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_2b0._24_8_ = p_Var16[3]._M_t;
      local_2b0._0_8_ = (long)local_2b0 + 0x10;
    }
    else {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    local_2b0._8_8_ = p_Var16[1]._M_t;
    p_Var16->_M_t =
         _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    p_Var16[1]._M_t = (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)0x0;
    *(undefined1 *)&p_Var16[2]._M_t = 0;
    std::__cxx11::to_string(&local_530,local_534);
    std::operator+(&local_4a8,"supposed object stream ",&local_530);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_4a8);
    local_398._0_8_ = *plVar11;
    peVar28 = (element_type *)(plVar11 + 2);
    if ((element_type *)local_398._0_8_ == peVar28) {
      local_388._0_8_ =
           *(undefined8 *)
            &(peVar28->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_388._8_8_ = plVar11[3];
      local_398._0_8_ = (element_type *)(local_398 + 0x10);
    }
    else {
      local_388._0_8_ =
           *(undefined8 *)
            &(peVar28->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
    }
    local_398._8_8_ = plVar11[1];
    *plVar11 = (long)peVar28;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    damagedPDF(pQVar15,(QPDF *)local_4f0,(string *)local_2b0,(string *)local_398);
    __cxa_throw(pQVar15,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_2b8.obj = local_534;
  local_2b8.gen = 0;
  pmVar9 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[](&((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                             *)&(local_4f0->super_InputSource)._vptr_InputSource)->
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)
                          ._M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                        &local_2b8);
  local_2d0 = pmVar9->end_before_space;
  pmVar9 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[](&((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                             *)&(pOVar35->super_InputSource)._vptr_InputSource)->
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)
                          ._M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                        &local_2b8);
  local_2d8 = pmVar9->end_after_space;
  pMVar10 = ::qpdf::Stream::stream(&local_488);
  local_3d8._M_dataplus._M_p =
       (pointer)(pMVar10->stream_dict).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_3d8._M_string_length =
       (size_type)
       (pMVar10->stream_dict).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._M_string_length)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._M_string_length)->
           _M_use_count + 1;
    }
  }
  local_2b0._8_8_ = 7;
  local_2b0._16_8_ = 0x6d74536a624f2f;
  puVar22 = (ulong *)(local_118 + 0x10);
  local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
  local_2b0._0_8_ = (long)local_2b0 + 0x10;
  local_118._0_8_ = puVar22;
  bVar5 = QPDFObjectHandle::isDictionaryOfType
                    ((QPDFObjectHandle *)&local_3d8,(string *)local_2b0,(string *)local_118);
  if ((ulong *)local_118._0_8_ != puVar22) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if (local_2b0._0_8_ != (long)local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  if (!bVar5) {
    uVar6 = -local_534;
    if (0 < (int)local_534) {
      uVar6 = local_534;
    }
    uVar36 = 1;
    if (9 < uVar6) {
      uVar26 = (ulong)uVar6;
      uVar34 = 4;
      do {
        uVar36 = uVar34;
        uVar17 = (uint)uVar26;
        if (uVar17 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_0023044d;
        }
        if (uVar17 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_0023044d;
        }
        if (uVar17 < 10000) goto LAB_0023044d;
        uVar26 = uVar26 / 10000;
        uVar34 = uVar36 + 4;
      } while (99999 < uVar17);
      uVar36 = uVar36 + 1;
    }
LAB_0023044d:
    uVar34 = local_534 >> 0x1f;
    local_398._0_8_ = local_398 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_398,(char)uVar36 - (char)((int)local_534 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_398._0_8_ + (ulong)uVar34),uVar36,uVar6);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)local_398,0,(char *)0x0,0x27b3b2);
    local_440._0_8_ = local_440 + 0x10;
    puVar19 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar19) {
      local_440._16_8_ = *puVar19;
      aStack_428._M_allocated_capacity = plVar11[3];
    }
    else {
      local_440._16_8_ = *puVar19;
      local_440._0_8_ = (ulong *)*plVar11;
    }
    local_440._8_8_ = plVar11[1];
    *plVar11 = (long)puVar19;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append(local_440);
    puVar19 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar19) {
      local_118._16_8_ = *puVar19;
      local_118._24_8_ = plVar11[3];
      local_118._0_8_ = puVar22;
    }
    else {
      local_118._16_8_ = *puVar19;
      local_118._0_8_ = (ulong *)*plVar11;
    }
    local_118._8_8_ = plVar11[1];
    *plVar11 = (long)puVar19;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    uVar6 = -local_534;
    if (0 < (int)local_534) {
      uVar6 = local_534;
    }
    uVar36 = 1;
    if (9 < uVar6) {
      uVar26 = (ulong)uVar6;
      uVar34 = 4;
      do {
        uVar36 = uVar34;
        uVar17 = (uint)uVar26;
        if (uVar17 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_002305b7;
        }
        if (uVar17 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_002305b7;
        }
        if (uVar17 < 10000) goto LAB_002305b7;
        uVar26 = uVar26 / 10000;
        uVar34 = uVar36 + 4;
      } while (99999 < uVar17);
      uVar36 = uVar36 + 1;
    }
LAB_002305b7:
    uVar34 = local_534 >> 0x1f;
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_510,(char)uVar36 - (char)((int)local_534 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)uVar34 + (long)local_510._M_dataplus._M_p),uVar36,uVar6);
    pQVar12 = (QPDFObjGen *)std::__cxx11::string::replace((ulong)&local_510,0,(char *)0x0,0x281f55);
    QVar32 = (QPDFObjGen)(pQVar12 + 2);
    if (*pQVar12 == QVar32) {
      local_530.field_2._M_allocated_capacity = *(undefined8 *)QVar32;
      local_530.field_2._8_8_ = pQVar12[3];
      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    }
    else {
      local_530.field_2._M_allocated_capacity = *(undefined8 *)QVar32;
      local_530._M_dataplus._M_p = (pointer)*pQVar12;
    }
    local_530._M_string_length = *(size_type *)(pQVar12 + 1);
    *pQVar12 = QVar32;
    pQVar12[1].obj = 0;
    pQVar12[1].gen = 0;
    *(undefined1 *)&pQVar12[2].obj = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_530);
    pOVar35 = local_4f0;
    psVar27 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar27) {
      local_4a8.field_2._M_allocated_capacity = *psVar27;
      local_4a8.field_2._8_8_ = plVar11[3];
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    }
    else {
      local_4a8.field_2._M_allocated_capacity = *psVar27;
      local_4a8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_4a8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar27;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    damagedPDF((QPDFExc *)local_2b0,(QPDF *)local_4f0,(string *)local_118,&local_4a8);
    warn((QPDF *)pOVar35,(QPDFExc *)local_2b0);
    QPDFExc::~QPDFExc((QPDFExc *)local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p,
                      (ulong)(local_530.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
    }
    if ((ulong *)local_118._0_8_ != puVar22) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
    }
    if ((element_type *)local_398._0_8_ != (element_type *)(local_398 + 0x10)) {
      operator_delete((void *)local_398._0_8_,local_388._0_8_ + 1);
    }
  }
  _Var33._M_head_impl = (Members *)(local_2b0 + 0x10);
  local_4cc = 0;
  local_4e4 = 0;
  local_2b0._8_8_ = 2;
  local_2b0._16_3_ = 0x4e2f;
  local_2b0._0_8_ = _Var33._M_head_impl;
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_118,&local_3d8);
  bVar5 = QPDFObjectHandle::getValueAsUInt((QPDFObjectHandle *)local_118,&local_4cc);
  if (bVar5) {
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    local_4a8._M_string_length = 6;
    local_4a8.field_2._M_allocated_capacity._0_7_ = 0x74737269462f;
    QPDFObjectHandle::getKey(&local_2c8,&local_3d8);
    bVar5 = QPDFObjectHandle::getValueAsInt(&local_2c8,&local_4e4);
    pOVar35 = local_4f0;
    if (local_2c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2c8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar5 = false;
    pOVar35 = local_4f0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  if ((Members *)local_2b0._0_8_ != _Var33._M_head_impl) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  if (bVar5 == false) {
    pQVar15 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::to_string((string *)local_440,local_534);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   "object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440);
    p_Var16 = (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
              std::__cxx11::string::append(local_118);
    local_2b0._0_8_ = p_Var16->_M_t;
    _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)(p_Var16 + 2);
    if ((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)local_2b0._0_8_ ==
        (_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
        _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl) {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_2b0._24_8_ = p_Var16[3]._M_t;
      local_2b0._0_8_ = (long)local_2b0 + 0x10;
    }
    else {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    local_2b0._8_8_ = p_Var16[1]._M_t;
    p_Var16->_M_t =
         _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    p_Var16[1]._M_t = (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)0x0;
    *(undefined1 *)&p_Var16[2]._M_t = 0;
    std::__cxx11::to_string(&local_510,local_534);
    std::operator+(&local_530,"object stream ",&local_510);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_530);
    local_398._0_8_ = *plVar11;
    peVar28 = (element_type *)(plVar11 + 2);
    if ((element_type *)local_398._0_8_ == peVar28) {
      local_388._0_8_ =
           *(undefined8 *)
            &(peVar28->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_388._8_8_ = plVar11[3];
      local_398._0_8_ = (element_type *)(local_398 + 0x10);
    }
    else {
      local_388._0_8_ =
           *(undefined8 *)
            &(peVar28->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
    }
    local_398._8_8_ = plVar11[1];
    *plVar11 = (long)peVar28;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    damagedPDF(pQVar15,(QPDF *)local_4f0,(string *)local_2b0,(string *)local_398);
    __cxa_throw(pQVar15,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_3b8 = (size_t *)0x0;
  psStack_3b0 = (size_t *)0x0;
  local_3a8 = 0;
  ::qpdf::Stream::getStreamData(&local_310,(qpdf_stream_decode_level_e)&local_488);
  local_2b0._8_8_ = 0;
  local_2b0._16_8_ = local_2b0._16_8_ & 0xffffffffffffff00;
  local_2b0._0_8_ = _Var33._M_head_impl;
  BufferInputSource::BufferInputSource
            ((BufferInputSource *)local_118,(string *)local_2b0,
             (Buffer *)
             local_310.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false);
  if ((Members *)local_2b0._0_8_ != _Var33._M_head_impl) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  local_470 = Buffer::getSize((Buffer *)
                              local_310.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_2e0 = Buffer::getBuffer((Buffer *)
                                local_310.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((long)local_470 <= (long)local_4e4) {
    pQVar15 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::to_string((string *)local_398,local_534);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                   "object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
    p_Var16 = (__uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
              std::__cxx11::string::append(local_440);
    local_2b0._0_8_ = p_Var16->_M_t;
    _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)(p_Var16 + 2);
    if ((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)local_2b0._0_8_ ==
        (_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
        _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl) {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_2b0._24_8_ = p_Var16[3]._M_t;
      local_2b0._0_8_ = (long)local_2b0 + 0x10;
    }
    else {
      local_2b0._16_8_ =
           *(undefined8 *)
            _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    local_2b0._8_8_ = p_Var16[1]._M_t;
    p_Var16->_M_t =
         _Var24._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    p_Var16[1]._M_t = (tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>)0x0;
    *(undefined1 *)&p_Var16[2]._M_t = 0;
    std::__cxx11::to_string(&local_4c8,local_534);
    std::operator+(&local_510,"object stream ",&local_4c8);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_510);
    local_530._M_dataplus._M_p = (pointer)*plVar11;
    psVar27 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_530._M_dataplus._M_p == psVar27) {
      local_530.field_2._M_allocated_capacity = *psVar27;
      local_530.field_2._8_8_ = *(QPDFObjGen *)(plVar11 + 3);
      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    }
    else {
      local_530.field_2._M_allocated_capacity = *psVar27;
    }
    local_530._M_string_length = plVar11[1];
    *plVar11 = (long)psVar27;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    damagedPDF(pQVar15,(QPDF *)local_4f0,(string *)local_2b0,&local_530);
    __cxa_throw(pQVar15,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_4d0 = 0;
  if (local_4cc == 0) {
    local_4e0 = 0xffffffffffffffff;
    uVar6 = 1;
  }
  else {
    local_4e0 = 0xffffffffffffffff;
    local_4d4 = (uint)CONCAT71((int7)(int3)((uint)local_4e4 >> 8),1);
    uVar36 = 0;
    do {
      _Var33._M_head_impl =
           (((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
            &(pOVar35->super_InputSource)._vptr_InputSource)->
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      ::qpdf::Tokenizer::readToken
                ((Token *)local_440,&(_Var33._M_head_impl)->tokenizer,(InputSource *)local_118,
                 &(_Var33._M_head_impl)->last_object_description,true,0);
      qVar13 = InputSource::getLastOffset((InputSource *)local_118);
      _Var33._M_head_impl =
           (((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
            &(pOVar35->super_InputSource)._vptr_InputSource)->
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      ::qpdf::Tokenizer::readToken
                ((Token *)local_398,&(_Var33._M_head_impl)->tokenizer,(InputSource *)local_118,
                 &(_Var33._M_head_impl)->last_object_description,true,0);
      if ((local_440._0_4_ != tt_integer) || (local_398._0_4_ != tt_integer)) {
        pQVar15 = (QPDFExc *)__cxa_allocate_exception(0x80);
        qVar13 = InputSource::getLastOffset((InputSource *)local_118);
        local_2b0._0_8_ = (long)local_2b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b0,"expected integer in object stream header","");
        resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                  (pQVar15,(anon_class_16_2_1298170d *)&local_3d8.field_2,0,qVar13,
                   (string *)local_2b0);
        __cxa_throw(pQVar15,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      uVar6 = QUtil::string_to_int((char *)local_440._8_8_);
      iVar7 = QUtil::string_to_int((char *)local_398._8_8_);
      if (uVar6 == local_534) {
        local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
        local_510._M_dataplus._M_p = (pointer)0x26;
        local_530._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_530,(ulong)&local_510);
        local_530.field_2._M_allocated_capacity = (size_type)local_510._M_dataplus._M_p;
        *(undefined8 *)((long)local_530._M_dataplus._M_p + 0x10) = 0x206f7420736d6961;
        *(undefined8 *)((long)local_530._M_dataplus._M_p + 0x18) = 0x206e6961746e6f63;
        *(undefined8 *)local_530._M_dataplus._M_p = 0x73207463656a626f;
        *(undefined8 *)((long)local_530._M_dataplus._M_p + 8) = 0x6c63206d61657274;
        builtin_strncpy((char *)((long)local_530._M_dataplus._M_p + 0x1e),"n itself",8);
        local_530._M_string_length = (size_type)local_510._M_dataplus._M_p;
        *(char *)((long)local_530._M_dataplus._M_p + (long)local_510._M_dataplus._M_p) = '\0';
        resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                  ((QPDFExc *)local_2b0,(anon_class_16_2_1298170d *)&local_3d8.field_2,uVar6,qVar13,
                   &local_530);
        warn((QPDF *)pOVar35,(QPDFExc *)local_2b0);
LAB_00230bcb:
        QPDFExc::~QPDFExc((QPDFExc *)local_2b0);
        uVar31 = local_530.field_2._M_allocated_capacity;
        QVar32 = (QPDFObjGen)local_530._M_dataplus;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
LAB_00230be7:
          operator_delete((void *)QVar32,(ulong)(uVar31 + 1));
        }
      }
      else {
        if ((int)uVar6 < 1) {
          local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
          local_510._M_dataplus._M_p = (pointer)0x14;
          local_530._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_530,(ulong)&local_510);
          local_530.field_2._M_allocated_capacity = (size_type)local_510._M_dataplus._M_p;
          *(undefined8 *)local_530._M_dataplus._M_p = 0x69207463656a626f;
          *(undefined8 *)((long)local_530._M_dataplus._M_p + 8) = 0x766e692073692064;
          ((QPDFObjGen *)((long)local_530._M_dataplus._M_p + 0x10))->obj = 0x64696c61;
          local_530._M_string_length = (size_type)local_510._M_dataplus._M_p;
          *(char *)((long)local_530._M_dataplus._M_p + (long)local_510._M_dataplus._M_p) = '\0';
          resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                    ((QPDFExc *)local_2b0,(anon_class_16_2_1298170d *)&local_3d8.field_2,uVar6,
                     qVar13,&local_530);
          warn((QPDF *)pOVar35,(QPDFExc *)local_2b0);
          goto LAB_00230bcb;
        }
        uVar26 = (ulong)iVar7;
        cVar2 = (char)(iVar7 >> 0x1f);
        if ((QPDFObjGen)(uVar26 - local_4e0) == (QPDFObjGen)0x0 || (long)uVar26 < (long)local_4e0) {
          local_468 = InputSource::getLastOffset((InputSource *)local_118);
          uVar23 = -uVar26;
          if (0 < (long)uVar26) {
            uVar23 = uVar26;
          }
          uVar34 = 1;
          if (9 < uVar23) {
            uVar20 = uVar23;
            uVar17 = 4;
            do {
              uVar34 = uVar17;
              if (uVar20 < 100) {
                uVar34 = uVar34 - 2;
                goto LAB_00230def;
              }
              if (uVar20 < 1000) {
                uVar34 = uVar34 - 1;
                goto LAB_00230def;
              }
              if (uVar20 < 10000) goto LAB_00230def;
              bVar5 = 99999 < uVar20;
              uVar20 = uVar20 / 10000;
              uVar17 = uVar34 + 4;
            } while (bVar5);
            uVar34 = uVar34 + 1;
          }
LAB_00230def:
          local_300[0] = (QPDFObjGen)&local_2f0;
          std::__cxx11::string::_M_construct((ulong)local_300,(char)uVar34 - cVar2);
          std::__detail::__to_chars_10_impl<unsigned_long_long>
                    ((char *)((long)local_300[0] - ((long)uVar26 >> 0x3f)),uVar34,uVar23);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)local_300,0,(char *)0x0,0x281dfb);
          local_330 = &local_320;
          plVar21 = plVar11 + 2;
          if ((long *)*plVar11 == plVar21) {
            local_320 = *plVar21;
            lStack_318 = plVar11[3];
          }
          else {
            local_320 = *plVar21;
            local_330 = (long *)*plVar11;
          }
          local_328 = plVar11[1];
          *plVar11 = (long)plVar21;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_330);
          puVar22 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar22) {
            local_4c8.field_2._M_allocated_capacity = *puVar22;
            local_4c8.field_2._8_8_ = plVar11[3];
            local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
          }
          else {
            local_4c8.field_2._M_allocated_capacity = *puVar22;
            local_4c8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_4c8._M_string_length = plVar11[1];
          *plVar11 = (long)puVar22;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          uVar26 = -local_4e0;
          if (0 < (long)local_4e0) {
            uVar26 = local_4e0;
          }
          uVar34 = 1;
          if (9 < uVar26) {
            uVar23 = uVar26;
            uVar17 = 4;
            do {
              uVar34 = uVar17;
              if (uVar23 < 100) {
                uVar34 = uVar34 - 2;
                goto LAB_00230f78;
              }
              if (uVar23 < 1000) {
                uVar34 = uVar34 - 1;
                goto LAB_00230f78;
              }
              if (uVar23 < 10000) goto LAB_00230f78;
              bVar5 = 99999 < uVar23;
              uVar23 = uVar23 / 10000;
              uVar17 = uVar34 + 4;
            } while (bVar5);
            uVar34 = uVar34 + 1;
          }
LAB_00230f78:
          lVar3 = (long)local_4e0 >> 0x3f;
          local_460 = local_450;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_460,(char)uVar34 - (char)((long)local_4e0 >> 0x3f));
          std::__detail::__to_chars_10_impl<unsigned_long_long>
                    ((char *)((long)local_460 - lVar3),uVar34,uVar26);
          pOVar35 = local_4f0;
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
            uVar31 = local_4c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < local_458 + local_4c8._M_string_length) {
            uVar26 = 0xf;
            if (local_460 != local_450) {
              uVar26 = local_450[0];
            }
            if (uVar26 < local_458 + local_4c8._M_string_length) goto LAB_00231020;
            pQVar12 = (QPDFObjGen *)
                      std::__cxx11::string::replace
                                ((ulong)&local_460,0,(char *)0x0,(ulong)local_4c8._M_dataplus._M_p);
          }
          else {
LAB_00231020:
            pQVar12 = (QPDFObjGen *)
                      std::__cxx11::string::_M_append((char *)&local_4c8,(ulong)local_460);
          }
          QVar32 = (QPDFObjGen)(pQVar12 + 2);
          if (*pQVar12 == QVar32) {
            local_510.field_2._M_allocated_capacity = *(undefined8 *)QVar32;
            local_510.field_2._8_8_ = pQVar12[3];
            local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
          }
          else {
            local_510.field_2._M_allocated_capacity = *(undefined8 *)QVar32;
            local_510._M_dataplus._M_p = (pointer)*pQVar12;
          }
          local_510._M_string_length = *(size_type *)(pQVar12 + 1);
          *pQVar12 = QVar32;
          pQVar12[1].obj = 0;
          pQVar12[1].gen = 0;
          *(undefined1 *)QVar32 = 0;
          pQVar12 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_510);
          local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
          QVar32 = (QPDFObjGen)(pQVar12 + 2);
          if (*pQVar12 == QVar32) {
            local_530.field_2._M_allocated_capacity = *(undefined8 *)QVar32;
            local_530.field_2._8_8_ = pQVar12[3];
          }
          else {
            local_530.field_2._M_allocated_capacity = *(undefined8 *)QVar32;
            local_530._M_dataplus._M_p = (pointer)*pQVar12;
          }
          local_530._M_string_length = *(size_type *)(pQVar12 + 1);
          *pQVar12 = QVar32;
          pQVar12[1].obj = 0;
          pQVar12[1].gen = 0;
          *(undefined1 *)&pQVar12[2].obj = 0;
          resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                    ((QPDFExc *)local_2b0,(anon_class_16_2_1298170d *)&local_3d8.field_2,uVar6,
                     local_468,&local_530);
          warn((QPDF *)pOVar35,(QPDFExc *)local_2b0);
          QPDFExc::~QPDFExc((QPDFExc *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._M_dataplus._M_p != &local_530.field_2) {
            operator_delete(local_530._M_dataplus._M_p,
                            (ulong)(local_530.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
          }
          if (local_460 != local_450) {
            operator_delete(local_460,local_450[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
            operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
          }
          if (local_330 != &local_320) {
            operator_delete(local_330,local_320 + 1);
          }
          uVar31 = local_2f0;
          QVar32 = local_300[0];
          if (local_300[0] == (QPDFObjGen)&local_2f0) goto LAB_00230bef;
          goto LAB_00230be7;
        }
        if ((int)uVar6 <=
            ((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true> *)
              &(pOVar35->super_InputSource)._vptr_InputSource)->
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table_max_id) {
          if ((long)((long)local_4e4 + uVar26) < (long)local_470) {
            if ((local_4d4 & 1) == 0) {
              local_2b0._0_8_ = local_4e0 + (long)local_4e4;
              local_530._M_dataplus._M_p = (pointer)(uVar26 - local_4e0);
              std::
              vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
              ::emplace_back<int&,long_long,unsigned_long>
                        ((vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
                          *)&local_3b8,(int *)&local_4d0,(longlong *)local_2b0,
                         (unsigned_long *)&local_530);
              local_4e0 = uVar26;
              local_4d0 = uVar6;
            }
            else {
              local_4d4 = 0;
              local_4e0 = uVar26;
              local_4d0 = uVar6;
            }
          }
          else {
            local_468 = InputSource::getLastOffset((InputSource *)local_118);
            uVar23 = -uVar26;
            if (0 < (long)uVar26) {
              uVar23 = uVar26;
            }
            uVar34 = 1;
            if (9 < uVar23) {
              uVar20 = uVar23;
              uVar17 = 4;
              do {
                uVar34 = uVar17;
                if (uVar20 < 100) {
                  uVar34 = uVar34 - 2;
                  goto LAB_00231236;
                }
                if (uVar20 < 1000) {
                  uVar34 = uVar34 - 1;
                  goto LAB_00231236;
                }
                if (uVar20 < 10000) goto LAB_00231236;
                bVar5 = 99999 < uVar20;
                uVar20 = uVar20 / 10000;
                uVar17 = uVar34 + 4;
              } while (bVar5);
              uVar34 = uVar34 + 1;
            }
LAB_00231236:
            local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_4c8,(char)uVar34 - cVar2);
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (local_4c8._M_dataplus._M_p + -((long)uVar26 >> 0x3f),uVar34,uVar23);
            pQVar12 = (QPDFObjGen *)
                      std::__cxx11::string::replace((ulong)&local_4c8,0,(char *)0x0,0x281dfb);
            pOVar35 = local_4f0;
            QVar32 = (QPDFObjGen)(pQVar12 + 2);
            if (*pQVar12 == QVar32) {
              local_510.field_2._M_allocated_capacity = *(undefined8 *)QVar32;
              local_510.field_2._8_8_ = pQVar12[3];
              local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
            }
            else {
              local_510.field_2._M_allocated_capacity = *(undefined8 *)QVar32;
              local_510._M_dataplus._M_p = (pointer)*pQVar12;
            }
            local_510._M_string_length = *(size_type *)(pQVar12 + 1);
            *pQVar12 = QVar32;
            pQVar12[1].obj = 0;
            pQVar12[1].gen = 0;
            *(undefined1 *)&pQVar12[2].obj = 0;
            pQVar12 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_510);
            local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
            QVar32 = (QPDFObjGen)(pQVar12 + 2);
            if (*pQVar12 == QVar32) {
              local_530.field_2._M_allocated_capacity = *(undefined8 *)QVar32;
              local_530.field_2._8_8_ = pQVar12[3];
            }
            else {
              local_530.field_2._M_allocated_capacity = *(undefined8 *)QVar32;
              local_530._M_dataplus._M_p = (pointer)*pQVar12;
            }
            local_530._M_string_length = *(size_type *)(pQVar12 + 1);
            *pQVar12 = QVar32;
            pQVar12[1].obj = 0;
            pQVar12[1].gen = 0;
            *(undefined1 *)&pQVar12[2].obj = 0;
            resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                      ((QPDFExc *)local_2b0,(anon_class_16_2_1298170d *)&local_3d8.field_2,uVar6,
                       local_468,&local_530);
            warn((QPDF *)pOVar35,(QPDFExc *)local_2b0);
            QPDFExc::~QPDFExc((QPDFExc *)local_2b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_530._M_dataplus._M_p != &local_530.field_2) {
              operator_delete(local_530._M_dataplus._M_p,
                              (ulong)(local_530.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != &local_510.field_2) {
              operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
              operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
LAB_00230bef:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_p != &local_340) {
        operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_p != &local_360) {
        operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_388 + 8)) {
        operator_delete((void *)local_398._8_8_,local_388._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_p != &local_3e8) {
        operator_delete(local_3f8._M_p,local_3e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._8_8_ != &aStack_428) {
        operator_delete((void *)local_440._8_8_,aStack_428._0_8_ + 1);
      }
      uVar36 = uVar36 + 1;
      uVar6 = local_4d4;
    } while (uVar36 < local_4cc);
  }
  if ((uVar6 & 1) == 0) {
    local_2b0._0_8_ = local_4e0 + (long)local_4e4;
    local_440._0_8_ = local_470 - local_2b0._0_8_;
    std::
    vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
    ::emplace_back<int&,long_long,unsigned_long>
              ((vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
                *)&local_3b8,(int *)&local_4d0,(longlong *)local_2b0,(unsigned_long *)local_440);
  }
  psVar4 = psStack_3b0;
  if (local_3b8 != psStack_3b0) {
    psVar30 = local_3b8;
    do {
      local_530._M_dataplus._M_p._4_4_ = 0;
      local_530._M_dataplus._M_p._0_4_ = (uint)psVar30[2];
      iVar14 = std::
               _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
               ::find(&(((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                            *)&(pOVar35->super_InputSource)._vptr_InputSource)->
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>).
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table).
                       _M_t,(key_type *)&local_530);
      if (iVar14._M_node !=
          (_Base_ptr)
          ((long)&((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                      *)&(pOVar35->super_InputSource)._vptr_InputSource)->
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>)._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table + 8U)) {
        iVar7 = QPDFXRefEntry::getType((QPDFXRefEntry *)&iVar14._M_node[1]._M_parent);
        if ((iVar7 == 2) &&
           (uVar6 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&iVar14._M_node[1]._M_parent)
           , uVar6 == local_534)) {
          Buffer::Buffer((Buffer *)&local_510,local_2e0 + psVar30[1],*psVar30);
          local_440._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_440._16_8_ = local_440._16_8_ & 0xffffffffffffff00;
          local_440._0_8_ = local_440 + 0x10;
          ::qpdf::is::OffsetBuffer::OffsetBuffer
                    ((OffsetBuffer *)local_2b0,(string *)local_440,(Buffer *)&local_510,psVar30[1]);
          pOVar35 = local_4f0;
          if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
            operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
          }
          readObjectInStream((QPDF *)local_440,pOVar35,(int)local_2b0,local_534);
          local_398._0_8_ = local_440._0_8_;
          local_398._8_8_ = local_440._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_440._8_8_ + 8) = *(int *)(local_440._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_440._8_8_ + 8) = *(int *)(local_440._8_8_ + 8) + 1;
            }
          }
          updateCache((QPDF *)pOVar35,(QPDFObjGen)local_530._M_dataplus._M_p,
                      (shared_ptr<QPDFObject> *)local_398,local_2d0,local_2d8,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_440._8_8_);
          }
          BufferInputSource::~BufferInputSource(&local_208);
          Buffer::~Buffer((Buffer *)&local_510);
        }
      }
      psVar30 = psVar30 + 3;
      pOVar35 = local_4f0;
    } while (psVar30 != psVar4);
  }
  BufferInputSource::~BufferInputSource((BufferInputSource *)local_118);
  if (local_310.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_310.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_3b8 != (size_t *)0x0) {
    operator_delete(local_3b8,local_3a8 - (long)local_3b8);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._M_string_length);
  }
  if (local_488.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_488.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDF::resolveObjectsInStream(int obj_stream_number)
{
    auto damaged =
        [this, obj_stream_number](int id, qpdf_offset_t offset, std::string const& msg) -> QPDFExc {
        return {
            qpdf_e_damaged_pdf,
            m->file->getName() + " object stream " + std::to_string(obj_stream_number),
            +"object " + std::to_string(id) + " 0",
            offset,
            msg,
            true};
    };

    if (m->resolved_object_streams.count(obj_stream_number)) {
        return;
    }
    m->resolved_object_streams.insert(obj_stream_number);
    // Force resolution of object stream
    auto obj_stream = getObject(obj_stream_number, 0).as_stream();
    if (!obj_stream) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "supposed object stream " + std::to_string(obj_stream_number) + " is not a stream");
    }

    // For linearization data in the object, use the data from the object stream for the objects in
    // the stream.
    QPDFObjGen stream_og(obj_stream_number, 0);
    qpdf_offset_t end_before_space = m->obj_cache[stream_og].end_before_space;
    qpdf_offset_t end_after_space = m->obj_cache[stream_og].end_after_space;

    QPDFObjectHandle dict = obj_stream.getDict();
    if (!dict.isDictionaryOfType("/ObjStm")) {
        QTC::TC("qpdf", "QPDF ERR object stream with wrong type");
        warn(damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "supposed object stream " + std::to_string(obj_stream_number) + " has wrong type"));
    }

    unsigned int n{0};
    int first{0};
    if (!(dict.getKey("/N").getValueAsUInt(n) && dict.getKey("/First").getValueAsInt(first))) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "object stream " + std::to_string(obj_stream_number) + " has incorrect keys");
    }

    // id, offset, size
    std::vector<std::tuple<int, qpdf_offset_t, size_t>> offsets;

    auto bp = obj_stream.getStreamData(qpdf_dl_specialized);

    BufferInputSource input("", bp.get());

    const auto b_size = bp->getSize();
    const auto end_offset = static_cast<qpdf_offset_t>(b_size);
    auto b_start = bp->getBuffer();

    if (first >= end_offset) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "object stream " + std::to_string(obj_stream_number) + " has invalid /First entry");
    }

    int id = 0;
    long long last_offset = -1;
    bool is_first = true;
    for (unsigned int i = 0; i < n; ++i) {
        auto tnum = readToken(input);
        auto id_offset = input.getLastOffset();
        auto toffset = readToken(input);
        if (!(tnum.isInteger() && toffset.isInteger())) {
            throw damaged(0, input.getLastOffset(), "expected integer in object stream header");
        }

        int num = QUtil::string_to_int(tnum.getValue().c_str());
        long long offset = QUtil::string_to_int(toffset.getValue().c_str());

        if (num == obj_stream_number) {
            QTC::TC("qpdf", "QPDF ignore self-referential object stream");
            warn(damaged(num, id_offset, "object stream claims to contain itself"));
            continue;
        }

        if (num < 1) {
            QTC::TC("qpdf", "QPDF object stream contains id < 1");
            warn(damaged(num, id_offset, "object id is invalid"s));
            continue;
        }

        if (offset <= last_offset) {
            QTC::TC("qpdf", "QPDF object stream offsets not increasing");
            warn(damaged(
                num,
                input.getLastOffset(),
                "offset " + std::to_string(offset) +
                    " is invalid (must be larger than previous offset " +
                    std::to_string(last_offset) + ")"));
            continue;
        }

        if (num > m->xref_table_max_id) {
            continue;
        }

        if (first + offset >= end_offset) {
            warn(damaged(
                num, input.getLastOffset(), "offset " + std::to_string(offset) + " is too large"));
            continue;
        }

        if (is_first) {
            is_first = false;
        } else {
            offsets.emplace_back(
                id, last_offset + first, static_cast<size_t>(offset - last_offset));
        }

        last_offset = offset;
        id = num;
    }

    if (!is_first) {
        // We found at least one valid entry.
        offsets.emplace_back(
            id, last_offset + first, b_size - static_cast<size_t>(last_offset + first));
    }

    // To avoid having to read the object stream multiple times, store all objects that would be
    // found here in the cache.  Remember that some objects stored here might have been overridden
    // by new objects appended to the file, so it is necessary to recheck the xref table and only
    // cache what would actually be resolved here.
    for (auto const& [obj_id, obj_offset, obj_size]: offsets) {
        QPDFObjGen og(obj_id, 0);
        auto entry = m->xref_table.find(og);
        if (entry != m->xref_table.end() && entry->second.getType() == 2 &&
            entry->second.getObjStreamNumber() == obj_stream_number) {
            Buffer obj_buffer{b_start + obj_offset, obj_size};
            is::OffsetBuffer in("", &obj_buffer, obj_offset);
            auto oh = readObjectInStream(in, obj_stream_number, obj_id);
            updateCache(og, oh.getObj(), end_before_space, end_after_space);
        } else {
            QTC::TC("qpdf", "QPDF not caching overridden objstm object");
        }
    }
}